

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O1

bool AppInitSanityChecks(Context *kernel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  long in_FS_OFFSET;
  Result<void> result;
  char *local_100;
  bilingual_str local_f8;
  bilingual_str local_b8;
  _Variant_storage<false,_bilingual_str,_std::monostate> local_78;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ::kernel::SanityChecks((Result<void> *)&local_78,kernel);
  if (local_78._M_index == '\x01') {
    bVar4 = ECC_InitSanityCheck();
    if (bVar4) {
      bVar4 = LockDataDirectory(true);
      goto LAB_008ae008;
    }
    local_f8.original._M_dataplus._M_p = (pointer)&local_f8.original.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,
               "Elliptic curve cryptography sanity check failure. %s is shutting down.","");
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_f8.translated._M_dataplus._M_p = (pointer)&local_f8.translated.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8.translated,
                 "Elliptic curve cryptography sanity check failure. %s is shutting down.","");
    }
    else {
      local_100 = "Elliptic curve cryptography sanity check failure. %s is shutting down.";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_f8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_100);
    }
    tinyformat::format<char[13]>(&local_b8,&local_f8,(char (*) [13])"Bitcoin Core");
    bVar4 = InitError(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.translated._M_dataplus._M_p != &local_b8.translated.field_2) {
      operator_delete(local_b8.translated._M_dataplus._M_p,
                      local_b8.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.original._M_dataplus._M_p != &local_b8.original.field_2) {
      operator_delete(local_b8.original._M_dataplus._M_p,
                      local_b8.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.translated._M_dataplus._M_p != &local_f8.translated.field_2) goto LAB_008adfe4;
  }
  else {
    util::ErrorString<void>(&local_b8,(Result<void> *)&local_78);
    InitError(&local_b8);
    paVar3 = &local_b8.translated.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.translated._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8.translated._M_dataplus._M_p,
                      local_b8.translated.field_2._M_allocated_capacity + 1);
    }
    paVar1 = &local_b8.original.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.original._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8.original._M_dataplus._M_p,
                      local_b8.original.field_2._M_allocated_capacity + 1);
    }
    local_f8.original._M_dataplus._M_p = (pointer)&local_f8.original.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"Initialization sanity check failed. %s is shutting down.","");
    paVar2 = &local_f8.translated.field_2;
    if (G_TRANSLATION_FUN_abi_cxx11_.super__Function_base._M_manager == (_Manager_type)0x0) {
      local_f8.translated._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8.translated,
                 "Initialization sanity check failed. %s is shutting down.","");
    }
    else {
      local_100 = "Initialization sanity check failed. %s is shutting down.";
      (*G_TRANSLATION_FUN_abi_cxx11_._M_invoker)
                (&local_f8.translated,(_Any_data *)&G_TRANSLATION_FUN_abi_cxx11_,&local_100);
    }
    tinyformat::format<char[13]>(&local_b8,&local_f8,(char (*) [13])"Bitcoin Core");
    bVar4 = InitError(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.translated._M_dataplus._M_p != paVar3) {
      operator_delete(local_b8.translated._M_dataplus._M_p,
                      local_b8.translated.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8.original._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8.original._M_dataplus._M_p,
                      local_b8.original.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8.translated._M_dataplus._M_p != paVar2) {
LAB_008adfe4:
      operator_delete(local_f8.translated._M_dataplus._M_p,
                      local_f8.translated.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8.original._M_dataplus._M_p != &local_f8.original.field_2) {
    operator_delete(local_f8.original._M_dataplus._M_p,
                    local_f8.original.field_2._M_allocated_capacity + 1);
  }
LAB_008ae008:
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
  ~_Variant_storage(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool AppInitSanityChecks(const kernel::Context& kernel)
{
    // ********************************************************* Step 4: sanity checks
    auto result{kernel::SanityChecks(kernel)};
    if (!result) {
        InitError(util::ErrorString(result));
        return InitError(strprintf(_("Initialization sanity check failed. %s is shutting down."), PACKAGE_NAME));
    }

    if (!ECC_InitSanityCheck()) {
        return InitError(strprintf(_("Elliptic curve cryptography sanity check failure. %s is shutting down."), PACKAGE_NAME));
    }

    // Probe the data directory lock to give an early error message, if possible
    // We cannot hold the data directory lock here, as the forking for daemon() hasn't yet happened,
    // and a fork will cause weird behavior to it.
    return LockDataDirectory(true);
}